

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputVenueMessageContent.h
# Opt level: O0

void __thiscall
TgBot::InputVenueMessageContent::InputVenueMessageContent(InputVenueMessageContent *this)

{
  allocator local_31;
  string local_30;
  InputVenueMessageContent *local_10;
  InputVenueMessageContent *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"InputVenueMessageContent",&local_31);
  InputMessageContent::InputMessageContent(&this->super_InputMessageContent,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputVenueMessageContent_0051b9a0;
  std::__cxx11::string::string((string *)&this->title);
  std::__cxx11::string::string((string *)&this->address);
  std::__cxx11::string::string((string *)&this->foursquareId);
  std::__cxx11::string::string((string *)&this->foursquareType);
  return;
}

Assistant:

InputVenueMessageContent() :
        InputMessageContent("InputVenueMessageContent")
    {}